

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O1

void __thiscall SSD1306::OledBitmap<128,_64>::xorPixel(OledBitmap<128,_64> *this,OledPoint p)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  bVar3 = OledPixel::pixelInside(&this->super_OledPixel,p);
  if (bVar3) {
    iVar2 = p.m_x;
    iVar4 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    bVar5 = 7 - ((char)p.m_x - ((byte)iVar4 & 0xf8));
    bVar1 = (this->blocks_)._M_elems[(long)p >> 0x20]._M_elems[iVar4 >> 3];
    bVar7 = (byte)(1 << (bVar5 & 0x1f));
    bVar6 = ~bVar7 & bVar1;
    if ((bVar1 >> (bVar5 & 0x1f) & 1) == 0) {
      bVar6 = bVar7 | bVar1;
    }
    (this->blocks_)._M_elems[(long)p >> 0x20]._M_elems[iVar4 >> 3] = bVar6;
  }
  return;
}

Assistant:

void
    xorPixel(
        SSD1306::OledPoint p) override
    {

        if (not pixelInside(p))
        {
            return;
        }

        PixelOffset offset{p};

        if (blocks_[offset.block][offset.byte] & (1 << offset.bit))
        {
            blocks_[offset.block][offset.byte] &= ~(1 << offset.bit);
        }
        else
        {
            blocks_[offset.block][offset.byte] |= (1 << offset.bit);
        }
    }